

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void baryonyx::itm::
     init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>
               (bit_array *x_pessimistic,bit_array *x_optimistic,random_engine *rng,
               default_cost_type<float> *c,
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *constraints,double init_random)

{
  pointer pfVar1;
  float *pfVar2;
  function_element fVar3;
  ulong uVar4;
  pointer prVar5;
  merged_constraint *cst;
  pointer pmVar6;
  long lVar7;
  size_type __n;
  function_element *pfVar8;
  long lVar9;
  merged_constraint *cst_1;
  pointer pmVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  int *piVar15;
  pointer prVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  double dVar20;
  allocator_type local_81;
  vector<reduced_cost,_std::allocator<reduced_cost>_> R;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  
  __n = 0;
  for (pmVar6 = (constraints->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pmVar6 != (constraints->
                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                )._M_impl.super__Vector_impl_data._M_finish; pmVar6 = pmVar6 + 1) {
    uVar12 = (ulong)((long)(pmVar6->elements).
                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pmVar6->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3;
    uVar13 = uVar12 & 0xffffffff;
    if ((int)uVar12 < (int)__n) {
      uVar13 = __n;
    }
    __n = uVar13;
  }
  std::vector<reduced_cost,_std::allocator<reduced_cost>_>::vector(&R,__n,&local_81);
  pmVar6 = (constraints->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pmVar10 = (constraints->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pmVar10 == pmVar6) {
      std::_Vector_base<reduced_cost,_std::allocator<reduced_cost>_>::~_Vector_base
                (&R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>);
      return;
    }
    dVar20 = std::
             generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                       (rng);
    if (dVar20 < init_random) {
      std::vector<reduced_cost,_std::allocator<reduced_cost>_>::resize
                (&R,(long)(pmVar10->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pmVar10->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3);
      pfVar1 = (pmVar10->elements).
               super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pfVar2 = (c->linear_elements)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
               ._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      uVar18 = (long)(pmVar10->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar1;
      uVar12 = uVar18 >> 3 & 0xffffffff;
      prVar5 = R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar13 = 0; pfVar8 = (function_element *)((long)prVar5 + 4), uVar12 != uVar13;
          uVar13 = uVar13 + 1) {
        fVar3 = pfVar1[uVar13];
        pfVar8[-1].variable_index = (index)pfVar2[(long)fVar3 >> 0x20];
        *pfVar8 = fVar3;
        prVar5 = (pointer)(pfVar8 + 1);
      }
      std::
      shuffle<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                ((__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                  )R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                  )R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                   super__Vector_impl_data._M_finish,rng);
      std::
      __sort<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::default_cost_type<float>,baryonyx::itm::maximize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::default_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if ((x_pessimistic->super_bit_array_impl).m_data._M_t.
          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
        iVar11 = 0;
        lVar9 = (long)(int)(uVar18 >> 3);
        lVar7 = -1;
        do {
          piVar15 = &R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar7].factor;
          do {
            if (lVar9 <= lVar7) {
              lVar7 = -2;
LAB_00130057:
              lVar9 = 8;
              uVar13 = uVar12;
              for (lVar17 = 0; lVar17 <= (int)lVar7; lVar17 = lVar17 + 1) {
                bit_array_impl::set(&x_pessimistic->super_bit_array_impl,
                                    *(int *)((long)&(R.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                            + lVar9));
                lVar9 = lVar9 + 0xc;
                uVar13 = uVar13 - 1;
              }
              while (bVar19 = uVar13 != 0, uVar13 = uVar13 - 1, bVar19) {
                bit_array_impl::unset
                          (&x_pessimistic->super_bit_array_impl,
                           *(int *)((long)&(R.
                                            super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->value +
                                   lVar9));
                lVar9 = lVar9 + 0xc;
              }
              goto LAB_001300ac;
            }
            if ((pmVar10->min <= iVar11) && (iVar11 <= pmVar10->max)) goto LAB_00130057;
            lVar7 = lVar7 + 1;
            piVar15 = piVar15 + 3;
          } while (lVar9 <= lVar7);
          iVar11 = iVar11 + *piVar15;
        } while( true );
      }
LAB_001300ac:
      if ((x_optimistic->super_bit_array_impl).m_data._M_t.
          super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
          super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
        iVar11 = 0;
        lVar7 = (long)(int)(uVar18 >> 3);
        uVar13 = 0xffffffffffffffff;
        uVar18 = 0xfffffffffffffffe;
        do {
          prVar5 = R.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar13 + 1;
          do {
            prVar16 = prVar5;
            iVar14 = (int)uVar18;
            if (lVar7 <= (long)uVar13) {
LAB_00130122:
              lVar7 = 8;
              for (lVar9 = 0; lVar9 <= iVar14; lVar9 = lVar9 + 1) {
                bit_array_impl::set(&x_optimistic->super_bit_array_impl,
                                    *(int *)((long)&(R.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                            + lVar7));
                lVar7 = lVar7 + 0xc;
                uVar12 = uVar12 - 1;
              }
              while (bVar19 = uVar12 != 0, uVar12 = uVar12 - 1, bVar19) {
                bit_array_impl::unset
                          (&x_optimistic->super_bit_array_impl,
                           *(int *)((long)&(R.
                                            super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->value +
                                   lVar7));
                lVar7 = lVar7 + 0xc;
              }
              goto LAB_0013016a;
            }
            uVar4 = uVar13;
            if (pmVar10->max < iVar11) {
              uVar4 = uVar18;
            }
            if (iVar11 < pmVar10->min) {
              uVar4 = uVar18;
            }
            uVar18 = uVar4 & 0xffffffff;
            uVar13 = uVar13 + 1;
            iVar14 = (int)uVar4;
            if (((iVar14 != -2) && ((long)uVar13 < lVar7)) && (prVar16->value < 0.0))
            goto LAB_00130122;
            prVar5 = prVar16 + 1;
          } while (lVar7 <= (long)uVar13);
          iVar11 = iVar11 + prVar16->factor;
        } while( true );
      }
    }
LAB_0013016a:
    pmVar10 = pmVar10 + 1;
  } while( true );
}

Assistant:

void
init_with_pre_solve(bit_array& x_pessimistic,
                    bit_array& x_optimistic,
                    random_engine& rng,
                    const Cost& c,
                    const std::vector<merged_constraint>& constraints,
                    const double init_random) noexcept
{
    int max_length = 0;
    for (const auto& cst : constraints)
        if (length(cst.elements) > max_length)
            max_length = length(cst.elements);

    struct reduced_cost
    {
        float value;
        int factor;
        int id;
    };

    std::vector<reduced_cost> R(max_length);
    std::bernoulli_distribution dist(init_random);

    for (const auto& cst : constraints) {
        if (!dist(rng))
            continue;

        R.resize(cst.elements.size());
        const int r_size = length(cst.elements);

        for (int i = 0; i != r_size; ++i) {
            R[i].value = static_cast<float>(c[cst.elements[i].variable_index]);
            R[i].factor = cst.elements[i].factor;
            R[i].id = cst.elements[i].variable_index;
        }

        std::shuffle(std::begin(R), std::end(R), rng);
        std::sort(
          std::begin(R), std::end(R), [](const auto& lhs, const auto& rhs) {
              return is_better_solution<Mode>(lhs.value, rhs.value);
          });

        if (!x_pessimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max) {
                    best = i;
                    break;
                }

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_pessimistic.set(R[i].id);

            for (; i != r_size; ++i) {
                x_pessimistic.unset(R[i].id);
            }
        }

        if (!x_optimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max)
                    best = i;

                if (best != -2 && i + 1 < r_size &&
                    stop_iterating<Mode>(R[i + 1].value))
                    break;

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_optimistic.set(R[i].id);

            for (; i != r_size; ++i)
                x_optimistic.unset(R[i].id);
        }
    }
}